

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# visitor_ict.cpp
# Opt level: O1

void __thiscall PrintICT::visit(PrintICT *this,CONST *node)

{
  long *plVar1;
  uint uVar2;
  
  if (this->level != 0) {
    uVar2 = 0;
    do {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"|    ",5);
      uVar2 = uVar2 + 1;
    } while (uVar2 < this->level);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"->",2);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"CONST",5);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,".",1);
  plVar1 = (long *)std::ostream::operator<<((ostream *)&std::cout,node->i);
  std::ios::widen((char)*(undefined8 *)(*plVar1 + -0x18) + (char)plVar1);
  std::ostream::put((char)plVar1);
  std::ostream::flush();
  return;
}

Assistant:

void PrintICT::visit(CONST *node) {
    for (unsigned int i = 0; i < this->level; i++)
        std::cout << "|    ";
    std::cout << "->" << "CONST" << "." << node->getI() << std::endl;
}